

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msg32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  code *pcVar4;
  int overflow;
  secp256k1_scalar s;
  secp256k1_scalar r;
  int local_11c;
  secp256k1_context *local_118;
  uchar *local_110;
  secp256k1_ecdsa_signature *local_108;
  void *local_100;
  secp256k1_scalar local_f8;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  secp256k1_scalar local_78;
  uchar local_58 [40];
  
  local_11c = 0;
  local_118 = ctx;
  local_110 = msg32;
  local_100 = noncedata;
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)",
               (ctx->illegal_callback).data);
  }
  else {
    pcVar4 = nonce_function_rfc6979;
    if (noncefp != (secp256k1_nonce_function)0x0) {
      pcVar4 = noncefp;
    }
    secp256k1_scalar_set_b32(&local_f8,seckey,&local_11c);
    if ((local_11c == 0) &&
       ((local_f8.d[3] != 0 || local_f8.d[1] != 0) || (local_f8.d[2] != 0 || local_f8.d[0] != 0))) {
      local_118 = (secp256k1_context *)&local_118->ecmult_gen_ctx;
      uVar3 = 0;
      local_108 = signature;
      secp256k1_scalar_set_b32(&local_78,local_110,(int *)0x0);
      while ((iVar1 = (*pcVar4)(local_58,local_110,seckey,(uchar *)0x0,local_100,uVar3), iVar1 != 0
             && (((secp256k1_scalar_set_b32(&local_d8,local_58,&local_11c), local_11c != 0 ||
                  ((local_d8.d[3] == 0 && local_d8.d[1] == 0) &&
                   (local_d8.d[2] == 0 && local_d8.d[0] == 0))) ||
                 (iVar2 = secp256k1_ecdsa_sig_sign
                                    ((secp256k1_ecmult_gen_context *)local_118,&local_98,&local_b8,
                                     &local_f8,&local_78,&local_d8,(int *)0x0), iVar2 == 0))))) {
        uVar3 = uVar3 + 1;
      }
      signature = local_108;
      if (iVar1 != 0) {
        *(uint64_t *)(local_108->data + 0x10) = local_98.d[2];
        *(uint64_t *)(local_108->data + 0x18) = local_98.d[3];
        *(uint64_t *)local_108->data = local_98.d[0];
        *(uint64_t *)(local_108->data + 8) = local_98.d[1];
        *(uint64_t *)(local_108->data + 0x20) = local_b8.d[0];
        *(uint64_t *)(local_108->data + 0x28) = local_b8.d[1];
        *(uint64_t *)(local_108->data + 0x30) = local_b8.d[2];
        *(uint64_t *)(local_108->data + 0x38) = local_b8.d[3];
        return iVar1;
      }
    }
    signature->data[0x30] = '\0';
    signature->data[0x31] = '\0';
    signature->data[0x32] = '\0';
    signature->data[0x33] = '\0';
    signature->data[0x34] = '\0';
    signature->data[0x35] = '\0';
    signature->data[0x36] = '\0';
    signature->data[0x37] = '\0';
    signature->data[0x38] = '\0';
    signature->data[0x39] = '\0';
    signature->data[0x3a] = '\0';
    signature->data[0x3b] = '\0';
    signature->data[0x3c] = '\0';
    signature->data[0x3d] = '\0';
    signature->data[0x3e] = '\0';
    signature->data[0x3f] = '\0';
    signature->data[0x20] = '\0';
    signature->data[0x21] = '\0';
    signature->data[0x22] = '\0';
    signature->data[0x23] = '\0';
    signature->data[0x24] = '\0';
    signature->data[0x25] = '\0';
    signature->data[0x26] = '\0';
    signature->data[0x27] = '\0';
    signature->data[0x28] = '\0';
    signature->data[0x29] = '\0';
    signature->data[0x2a] = '\0';
    signature->data[0x2b] = '\0';
    signature->data[0x2c] = '\0';
    signature->data[0x2d] = '\0';
    signature->data[0x2e] = '\0';
    signature->data[0x2f] = '\0';
    signature->data[0x10] = '\0';
    signature->data[0x11] = '\0';
    signature->data[0x12] = '\0';
    signature->data[0x13] = '\0';
    signature->data[0x14] = '\0';
    signature->data[0x15] = '\0';
    signature->data[0x16] = '\0';
    signature->data[0x17] = '\0';
    signature->data[0x18] = '\0';
    signature->data[0x19] = '\0';
    signature->data[0x1a] = '\0';
    signature->data[0x1b] = '\0';
    signature->data[0x1c] = '\0';
    signature->data[0x1d] = '\0';
    signature->data[0x1e] = '\0';
    signature->data[0x1f] = '\0';
    signature->data[0] = '\0';
    signature->data[1] = '\0';
    signature->data[2] = '\0';
    signature->data[3] = '\0';
    signature->data[4] = '\0';
    signature->data[5] = '\0';
    signature->data[6] = '\0';
    signature->data[7] = '\0';
    signature->data[8] = '\0';
    signature->data[9] = '\0';
    signature->data[10] = '\0';
    signature->data[0xb] = '\0';
    signature->data[0xc] = '\0';
    signature->data[0xd] = '\0';
    signature->data[0xe] = '\0';
    signature->data[0xf] = '\0';
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    /* Fail if the secret key is invalid. */
    if (!overflow && !secp256k1_scalar_is_zero(&sec)) {
        unsigned char nonce32[32];
        unsigned int count = 0;
        secp256k1_scalar_set_b32(&msg, msg32, NULL);
        while (1) {
            ret = noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            if (!overflow && !secp256k1_scalar_is_zero(&non)) {
                if (secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, &r, &s, &sec, &msg, &non, NULL)) {
                    break;
                }
            }
            count++;
        }
        memset(nonce32, 0, 32);
        secp256k1_scalar_clear(&msg);
        secp256k1_scalar_clear(&non);
        secp256k1_scalar_clear(&sec);
    }
    if (ret) {
        secp256k1_ecdsa_signature_save(signature, &r, &s);
    } else {
        memset(signature, 0, sizeof(*signature));
    }
    return ret;
}